

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void mpt_frange(float *range,int len,float *val,int ld)

{
  float fVar1;
  float *pfVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  
  if (len != 0) {
    fVar4 = *val;
    range[1] = fVar4;
    *range = fVar4;
    if (1 < len && ld != 0) {
      fVar4 = *range;
      fVar5 = range[1];
      iVar3 = len + 1;
      pfVar2 = val + ld;
      do {
        fVar1 = *pfVar2;
        if (fVar1 < fVar4) {
          *range = fVar1;
          fVar4 = fVar1;
        }
        fVar1 = *pfVar2;
        if (fVar5 < fVar1) {
          range[1] = fVar1;
          fVar5 = fVar1;
        }
        iVar3 = iVar3 + -1;
        pfVar2 = pfVar2 + ld;
      } while (2 < iVar3);
    }
    return;
  }
  range[0] = 0.0;
  range[1] = 0.0;
  return;
}

Assistant:

extern void MPT_RANGE_FCN(MPT_RANGE_T range[2], int len, const MPT_RANGE_T *val, int ld)
{
	if (!len) {
#ifdef __cplusplus
		range[0] = range[1] = MPT_RANGE_T();
#else
		range[0] = range[1] = 0;
#endif
		return;
	}
	range[0] = range[1] = *val;
	
	if (!ld) {
		return;
	}
	while (--len > 0) {
		val += ld;
		if (*val < range[0]) {
			range[0] = *val;
		}
		if (*val > range[1]) {
			range[1] = *val;
		}
	}
}